

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.h
# Opt level: O0

void __thiscall wasm::PassRunner::PassRunner(PassRunner *this,PassRunner *runner)

{
  PassRunner *runner_local;
  PassRunner *this_local;
  
  this->_vptr_PassRunner = (_func_int **)&PTR__PassRunner_027158e8;
  this->wasm = runner->wasm;
  this->allocator = runner->allocator;
  std::
  vector<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
  ::vector(&this->passes);
  PassOptions::PassOptions(&this->options,&runner->options);
  this->isNested = true;
  this->addedPassesRemovedDWARF = false;
  this->ran = false;
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set(&this->skippedPasses);
  return;
}

Assistant:

explicit PassRunner(const PassRunner* runner)
    : wasm(runner->wasm), allocator(runner->allocator),
      options(runner->options), isNested(true) {}